

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::AgeFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *age;
  allocator_type *in_stack_fffffffffffffb38;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb40;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb48;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb54;
  LogicalType *local_438;
  LogicalType *local_418;
  LogicalType local_3f0 [24];
  undefined1 local_3d8 [32];
  LogicalType local_3b8 [32];
  LogicalType *local_398;
  LogicalType local_390 [24];
  LogicalType local_378 [24];
  LogicalType *local_360;
  undefined8 local_358;
  undefined1 local_350 [24];
  ScalarFunction local_338;
  LogicalType local_210 [24];
  undefined1 local_1f8 [32];
  LogicalType local_1d8 [32];
  LogicalType *local_1b8;
  LogicalType local_1b0 [24];
  LogicalType *local_198;
  undefined8 local_190;
  undefined1 local_188 [24];
  ScalarFunction local_170;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"age",&local_31);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_1b8 = local_1b0;
  duckdb::LogicalType::LogicalType(local_1b8,TIMESTAMP);
  local_198 = local_1b0;
  local_190 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbdcbab);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffb50;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb48;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffb54;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb40,iVar1,in_stack_fffffffffffffb38);
  duckdb::LogicalType::LogicalType(local_1d8,INTERVAL);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),in_stack_fffffffffffffb48
            );
  duckdb::LogicalType::LogicalType(local_210,INVALID);
  __f = local_210;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_170,local_188,local_1d8,local_1f8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_210);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbdccac);
  duckdb::LogicalType::~LogicalType(local_1d8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbdccc6);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbdccd3);
  local_418 = (LogicalType *)&local_198;
  do {
    local_418 = local_418 + -0x18;
    duckdb::LogicalType::~LogicalType(local_418);
  } while (local_418 != local_1b0);
  local_398 = local_390;
  duckdb::LogicalType::LogicalType(local_398,TIMESTAMP);
  local_398 = local_378;
  duckdb::LogicalType::LogicalType(local_398,TIMESTAMP);
  local_360 = local_390;
  local_358 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbdcd8e);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffb54;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  duckdb::LogicalType::LogicalType(local_3b8,INTERVAL);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb54,uVar5),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_3f0,INVALID);
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_338,local_350,local_3b8,local_3d8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_3f0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbdce8f);
  duckdb::LogicalType::~LogicalType(local_3b8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbdcea9);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbdceb6);
  local_438 = (LogicalType *)&local_360;
  do {
    local_438 = local_438 + -0x18;
    duckdb::LogicalType::~LogicalType(local_438);
  } while (local_438 != local_390);
  return in_RDI;
}

Assistant:

ScalarFunctionSet AgeFun::GetFunctions() {
	ScalarFunctionSet age("age");
	age.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::INTERVAL, AgeFunctionStandard));
	age.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP}, LogicalType::INTERVAL, AgeFunction));
	return age;
}